

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void __thiscall FConsoleAlias::Realias(FConsoleAlias *this,char *command,bool noSave)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  
  uVar2 = CONCAT71(in_register_00000011,noSave);
  if ((int)uVar2 == 0) {
    uVar2 = (ulong)(*(int *)(this->m_Command[1].Chars + -0xc) != 0 || noSave);
  }
  FString::operator=(this->m_Command + (uVar2 & 0xff),command);
  pcVar1 = strchr(command,0x25);
  this->bDoSubstitution = pcVar1 != (char *)0x0;
  this->bKill = false;
  return;
}

Assistant:

void FConsoleAlias::Realias (const char *command, bool noSave)
{
	if (!noSave && !m_Command[1].IsEmpty())
	{
		noSave = true;
	}
	m_Command[noSave] = command;

	// If the command contains % characters, assume they are parameter markers
	// for substitution when the command is executed.
	bDoSubstitution = (strchr (command, '%') != NULL);
	bKill = false;
}